

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::PathTypeHandlerWithAttr::IsEnumerable
          (PathTypeHandlerWithAttr *this,DynamicObject *instance,PropertyId propertyId)

{
  code *pcVar1;
  bool bVar2;
  uint16 uVar3;
  PropertyIndex PVar4;
  TypePath *this_00;
  ObjectSlotAttributes **ppOVar5;
  undefined4 *puVar6;
  PropertyIndex propertyIndex;
  PropertyId propertyId_local;
  DynamicObject *instance_local;
  PathTypeHandlerWithAttr *this_local;
  
  this_00 = PathTypeHandlerBase::GetTypePath((PathTypeHandlerBase *)this);
  uVar3 = PathTypeHandlerBase::GetPathLength((PathTypeHandlerBase *)this);
  PVar4 = TypePath::LookupInline(this_00,propertyId,(uint)uVar3);
  if (PVar4 == 0xffff) {
    this_local._4_4_ = 1;
  }
  else {
    ppOVar5 = Memory::WriteBarrierPtr::operator_cast_to_ObjectSlotAttributes__
                        ((WriteBarrierPtr *)&this->attributes);
    if (*ppOVar5 == (ObjectSlotAttributes *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                  ,0xdfb,"(attributes)","attributes");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    ppOVar5 = Memory::WriteBarrierPtr::operator_cast_to_ObjectSlotAttributes__
                        ((WriteBarrierPtr *)&this->attributes);
    this_local._4_4_ = (*ppOVar5)[PVar4] & 1;
  }
  return this_local._4_4_;
}

Assistant:

BOOL PathTypeHandlerWithAttr::IsEnumerable(DynamicObject* instance, PropertyId propertyId)
    {
        PropertyIndex propertyIndex = GetTypePath()->LookupInline(propertyId, GetPathLength());
        if (propertyIndex != Constants::NoSlot)
        {
            Assert(attributes);
            return (attributes[propertyIndex] & ObjectSlotAttr_Enumerable);
        }
        return true;
    }